

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

string * vera::toString<int>(string *__return_storage_ptr__,int *_value,int _precision,int _width,
                            char _fill)

{
  long lVar1;
  ostringstream out;
  long local_1a8;
  long local_1a0 [2];
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
  lVar1 = *(long *)(local_1a8 + -0x18);
  if (acStack_c8[lVar1 + 1] == '\0') {
    std::ios::widen((char)&local_1a8 + (char)lVar1);
    acStack_c8[lVar1 + 1] = '\x01';
  }
  acStack_c8[lVar1] = _fill;
  *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = (long)_width;
  *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = (long)_precision;
  std::ostream::operator<<((ostream *)&local_1a8,*_value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString(const T& _value, int _precision, int _width, char _fill) {
    std::ostringstream out;
    out << std::fixed << std::setfill(_fill) << std::setw(_width) << std::setprecision(_precision) << _value;
    return out.str();
}